

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

string * libtorrent::filename(string *__return_storage_ptr__,string *f)

{
  size_type sVar1;
  char *pcVar2;
  long lVar3;
  allocator<char> *__a;
  char *__s;
  allocator<char> local_22;
  allocator<char> local_21;
  
  sVar1 = f->_M_string_length;
  if (sVar1 == 0) {
    pcVar2 = "";
    __a = &local_21;
  }
  else {
    __s = (f->_M_dataplus)._M_p;
    pcVar2 = strrchr(__s,0x2f);
    if (pcVar2 == (char *)0x0) {
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)f);
      return __return_storage_ptr__;
    }
    if ((long)pcVar2 - (long)__s == (long)((int)sVar1 + -1)) {
      lVar3 = 0;
      do {
        if (pcVar2 + lVar3 <= __s) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar2 = __s + -lVar3;
LAB_0021da54:
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)__return_storage_ptr__,__s,pcVar2);
          return __return_storage_ptr__;
        }
        if (pcVar2[lVar3 + -1] == '/') {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          __s = pcVar2 + lVar3;
          goto LAB_0021da54;
        }
        lVar3 = lVar3 + -1;
      } while( true );
    }
    pcVar2 = pcVar2 + 1;
    __a = &local_22;
  }
  ::std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,pcVar2,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string filename(std::string const& f)
	{
		if (f.empty()) return "";
		char const* first = f.c_str();
		char const* sep = std::strrchr(first, '/');
#if defined(TORRENT_WINDOWS) || defined(TORRENT_OS2)
		char const* altsep = std::strrchr(first, '\\');
		if (sep == nullptr || altsep > sep) sep = altsep;
#endif
		if (sep == nullptr) return f;

		if (sep - first == int(f.size()) - 1)
		{
			// if the last character is a / (or \)
			// ignore it
			int len = 0;
			while (sep > first)
			{
				--sep;
				if (*sep == '/'
#if defined(TORRENT_WINDOWS) || defined(TORRENT_OS2)
					|| *sep == '\\'
#endif
					)
					return std::string(sep + 1, std::size_t(len));
				++len;
			}
			return std::string(first, std::size_t(len));

		}
		return std::string(sep + 1);
	}